

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

void set_tx_type_prune(SPEED_FEATURES *sf,TxfmSearchParams *txfm_params,
                      int winner_mode_tx_type_pruning,int is_winner_mode)

{
  int prune_mode [4] [2];
  int is_winner_mode_local;
  int winner_mode_tx_type_pruning_local;
  TxfmSearchParams *txfm_params_local;
  SPEED_FEATURES *sf_local;
  
  txfm_params->prune_2d_txfm_mode = (uint)(sf->tx_sf).tx_type_search.prune_2d_txfm_mode;
  if (winner_mode_tx_type_pruning != 0) {
    prune_mode[0][0] = 3;
    prune_mode[0][1] = 0;
    prune_mode[1][0] = 4;
    prune_mode[1][1] = 0;
    prune_mode[2][0] = 5;
    prune_mode[2][1] = 2;
    prune_mode[3][0] = 5;
    prune_mode[3][1] = 3;
    txfm_params->prune_2d_txfm_mode = prune_mode[winner_mode_tx_type_pruning + -1][is_winner_mode];
  }
  return;
}

Assistant:

static inline void set_tx_type_prune(const SPEED_FEATURES *sf,
                                     TxfmSearchParams *txfm_params,
                                     int winner_mode_tx_type_pruning,
                                     int is_winner_mode) {
  // Populate prune transform mode appropriately
  txfm_params->prune_2d_txfm_mode = sf->tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (!winner_mode_tx_type_pruning) return;

  const int prune_mode[4][2] = { { TX_TYPE_PRUNE_3, TX_TYPE_PRUNE_0 },
                                 { TX_TYPE_PRUNE_4, TX_TYPE_PRUNE_0 },
                                 { TX_TYPE_PRUNE_5, TX_TYPE_PRUNE_2 },
                                 { TX_TYPE_PRUNE_5, TX_TYPE_PRUNE_3 } };
  txfm_params->prune_2d_txfm_mode =
      prune_mode[winner_mode_tx_type_pruning - 1][is_winner_mode];
}